

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall
QMdiAreaPrivate::resetActiveWindow(QMdiAreaPrivate *this,QMdiSubWindow *deactivatedWindow)

{
  QWidget *this_00;
  Data *pDVar1;
  bool bVar2;
  QObject *pQVar3;
  QWidget *this_01;
  long in_FS_OFFSET;
  undefined8 local_40;
  void *local_38;
  undefined8 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  if (deactivatedWindow == (QMdiSubWindow *)0x0) {
    pDVar1 = (this->aboutToBecomeActive).wp.d;
    if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
       ((this->aboutToBecomeActive).wp.value != (QObject *)0x0)) goto LAB_004479a8;
    pDVar1 = (this->active).wp.d;
    (this->active).wp.d = (Data *)0x0;
    (this->active).wp.value = (QObject *)0x0;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
  }
  else {
    pDVar1 = (this->active).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = (this->active).wp.value;
    }
    if (pQVar3 != (QObject *)deactivatedWindow) goto LAB_004479a8;
    (this->active).wp.d = (Data *)0x0;
    (this->active).wp.value = (QObject *)0x0;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
    pDVar1 = (this->aboutToBecomeActive).wp.d;
    if (((((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
         ((this->aboutToBecomeActive).wp.value != (QObject *)0x0)) ||
        ((this->isActivated != false || (bVar2 = lastWindowAboutToBeDestroyed(this), bVar2)))) &&
       (*(char *)(*(long *)&(deactivatedWindow->super_QWidget).field_0x8 + 0x2dc) == '\0')) {
      this_01 = QWidget::window(this_00);
      bVar2 = QWidget::isMinimized(this_01);
      if (!bVar2) goto LAB_004479a8;
    }
  }
  puStack_30 = &local_40;
  local_40 = 0;
  local_38 = (void *)0x0;
  QMetaObject::activate(&this_00->super_QObject,&QMdiArea::staticMetaObject,0,&local_38);
LAB_004479a8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::resetActiveWindow(QMdiSubWindow *deactivatedWindow)
{
    Q_Q(QMdiArea);
    if (deactivatedWindow) {
        if (deactivatedWindow != active)
            return;
        active = nullptr;
        if ((aboutToBecomeActive || isActivated || lastWindowAboutToBeDestroyed())
            && !isExplicitlyDeactivated(deactivatedWindow) && !q->window()->isMinimized()) {
            return;
        }
        emit q->subWindowActivated(nullptr);
        return;
    }

    if (aboutToBecomeActive)
        return;

    active = nullptr;
    emit q->subWindowActivated(nullptr);
}